

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O1

vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_> *
__thiscall
spvtools::opt::SENode::CollectRecurrentNodes
          (vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *__return_storage_ptr__,SENode *this)

{
  pointer *pppSVar1;
  iterator __position;
  pointer ppSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer ppSVar4;
  SERecurrentNode *recurrent_node;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*this->_vptr_SENode[6])(this);
  local_38.
  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SERecurrentNode *)
      local_38.
      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (SERecurrentNode *)0x0) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>::
      _M_realloc_insert<spvtools::opt::SERecurrentNode*const&>
                ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                  *)__return_storage_ptr__,__position,(SERecurrentNode **)&local_38);
    }
    else {
      *__position._M_current =
           (SERecurrentNode *)
           local_38.
           super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pppSVar1 = &(__return_storage_ptr__->
                  super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
  }
  ppSVar2 = (this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar2;
      ppSVar4 = ppSVar4 + 1) {
    CollectRecurrentNodes(&local_38,*ppSVar4);
    std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SERecurrentNode**,std::vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>>>
              ((vector<spvtools::opt::SERecurrentNode*,std::allocator<spvtools::opt::SERecurrentNode*>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               local_38.
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_38.
               super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if ((SERecurrentNode *)
        local_38.
        super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (SERecurrentNode *)0x0) {
      operator_delete(local_38.
                      super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SERecurrentNode*> CollectRecurrentNodes() {
    std::vector<SERecurrentNode*> recurrent_nodes{};

    if (auto recurrent_node = AsSERecurrentNode()) {
      recurrent_nodes.push_back(recurrent_node);
    }

    for (auto child : GetChildren()) {
      auto child_recurrent_nodes = child->CollectRecurrentNodes();
      recurrent_nodes.insert(recurrent_nodes.end(),
                             child_recurrent_nodes.begin(),
                             child_recurrent_nodes.end());
    }

    return recurrent_nodes;
  }